

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O2

ChUll * __thiscall ConvexBuilder::canMerge(ConvexBuilder *this,ChUll *a,ChUll *b)

{
  bool bVar1;
  uint uVar2;
  HullError HVar3;
  VertexLookup vc;
  float *pfVar4;
  ChUll *this_00;
  UintVector *in_RCX;
  ConvexBuilder *this_01;
  float fVar5;
  HullLibrary hl;
  HullResult hresult;
  UintVector indices;
  HullDesc local_f0;
  ConvexResult cr;
  
  this_01 = (ConvexBuilder *)a;
  bVar1 = ChUll::overlap((ChUll *)a,b);
  if (bVar1) {
    vc = Vl_createVertexLookup();
    indices.m_ownsMemory = true;
    indices.m_data = (uint *)0x0;
    indices.m_size = 0;
    indices.m_capacity = 0;
    getMesh(this_01,a->mResult,vc,in_RCX);
    getMesh(this_01,b->mResult,vc,in_RCX);
    uVar2 = Vl_getVcount(vc);
    pfVar4 = Vl_getVertices(vc);
    if (indices.m_size + 2U < 5) {
      Vl_releaseVertexLookup(vc);
      this_00 = (ChUll *)0x0;
    }
    else {
      hresult.mPolygons = true;
      hresult.mNumOutputVertices = 0;
      hresult.mOutputVertices._0_4_ = 0;
      hresult.mOutputVertices._4_4_ = 0;
      local_f0.mMaxVertices = 0x1000;
      local_f0.mMaxFaces = 0x1000;
      hresult.mNumFaces = 0;
      hresult.mNumIndices = 0;
      hresult.mIndices = (uint *)0x0;
      local_f0.mNormalEpsilon = 0.001;
      local_f0.mSkinWidth = 0.01;
      local_f0.mFlags = 1;
      local_f0.mVertexStride = 0xc;
      local_f0.mVcount = uVar2;
      local_f0.mVertices = pfVar4;
      HVar3 = ConvexDecomposition::HullLibrary::CreateConvexHull(&hl,&local_f0,&hresult);
      if ((HVar3 != QE_OK) ||
         (fVar5 = computeMeshVolume((float *)CONCAT44(hresult.mOutputVertices._4_4_,
                                                      hresult.mOutputVertices._0_4_),
                                    hresult.mNumFaces,hresult.mIndices),
         ((a->mVolume + b->mVolume) * 100.0) / fVar5 < 100.0 - MERGE_PERCENT)) {
        this_00 = (ChUll *)0x0;
      }
      else {
        ConvexDecomposition::ConvexResult::ConvexResult
                  (&cr,hresult.mNumOutputVertices,
                   (float *)CONCAT44(hresult.mOutputVertices._4_4_,hresult.mOutputVertices._0_4_),
                   hresult.mNumFaces,hresult.mIndices);
        this_00 = (ChUll *)::operator_new(0x28);
        ChUll::ChUll(this_00,&cr);
        ConvexDecomposition::ConvexResult::~ConvexResult(&cr);
      }
      Vl_releaseVertexLookup(vc);
    }
    cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&indices);
    return (ChUll *)this_00;
  }
  return (ChUll *)0x0;
}

Assistant:

ChUll * ConvexBuilder::canMerge(ChUll *a,ChUll *b)
{

	if ( !a->overlap(*b) ) return 0; // if their AABB's (with a little slop) don't overlap, then return.

	ChUll *ret = 0;

	// ok..we are going to combine both meshes into a single mesh
	// and then we are going to compute the concavity...

	VertexLookup vc = Vl_createVertexLookup();

	UintVector indices;

	getMesh( *a->mResult, vc, indices );
	getMesh( *b->mResult, vc, indices );

	unsigned int vcount = Vl_getVcount(vc);
	const float *vertices = Vl_getVertices(vc);
	unsigned int tcount = indices.size()/3;
	
	//don't do anything if hull is empty
	if (!tcount)
	{
		Vl_releaseVertexLookup (vc);
		return 0;
	}

	HullResult hresult;
	HullLibrary hl;
	HullDesc   desc;

	desc.SetHullFlag(QF_TRIANGLES);

	desc.mVcount       = vcount;
	desc.mVertices     = vertices;
	desc.mVertexStride = sizeof(float)*3;

	HullError hret = hl.CreateConvexHull(desc,hresult);

	if ( hret == QE_OK )
	{

		float combineVolume  = computeMeshVolume( hresult.mOutputVertices, hresult.mNumFaces, hresult.mIndices );
		float sumVolume      = a->mVolume + b->mVolume;

		float percent = (sumVolume*100) / combineVolume;
		if ( percent >= (100.0f-MERGE_PERCENT) )
		{
			ConvexResult cr(hresult.mNumOutputVertices, hresult.mOutputVertices, hresult.mNumFaces, hresult.mIndices);
			ret = new ChUll(cr);
		}
	}


	Vl_releaseVertexLookup(vc);

	return ret;
}